

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterBeam.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::Decode
          (UnderwaterAcousticEmitterBeam *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  UnderwaterAcousticEmitterBeam *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x18) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui8BeamDataLength);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8BeamIDNumber);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding1);
  operator>>(pKVar2,&(this->m_UAFPD).super_DataTypeBase);
  return;
}

Assistant:

void UnderwaterAcousticEmitterBeam::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < UNDERWATER_ACOUSTIC_EMITTER_BEAM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8BeamDataLength
           >> m_ui8BeamIDNumber
           >> m_ui16Padding1
           >> KDIS_STREAM m_UAFPD;
}